

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ClampWindowRect(ImGuiWindow *window,ImRect *rect,ImVec2 *padding)

{
  ImGuiContext *g;
  uint uVar1;
  uint uVar2;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float fVar3;
  float in_XMM1_Da;
  float fVar4;
  float in_XMM1_Db;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar7 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar7 = fVar7 * window->ParentWindow->FontWindowScale;
    }
    fVar3 = (GImGui->Style).FramePadding.y;
    IVar6.y = fVar3 + fVar3 + fVar7;
    IVar6.x = (window->Size).x;
  }
  else {
    IVar6 = window->Size;
  }
  auVar8._0_4_ = (rect->Max).x - in_XMM0_Da;
  auVar8._4_4_ = (rect->Max).y - in_XMM1_Da;
  auVar8._8_4_ = 0.0 - in_XMM0_Db;
  auVar8._12_4_ = 0.0 - in_XMM1_Db;
  fVar4 = (window->Pos).x + IVar6.x;
  fVar5 = (window->Pos).y + IVar6.y;
  fVar7 = in_XMM0_Da + (rect->Min).x;
  fVar3 = in_XMM1_Da + (rect->Min).y;
  uVar1 = -(uint)(fVar7 <= fVar4);
  uVar2 = -(uint)(fVar3 <= fVar5);
  auVar9._0_4_ = (float)(~uVar1 & (uint)fVar7 | (uint)fVar4 & uVar1) - IVar6.x;
  auVar9._4_4_ = (float)(~uVar2 & (uint)fVar3 | (uint)fVar5 & uVar2) - IVar6.y;
  auVar9._8_4_ = (float)(~-(uint)(in_XMM0_Db + 0.0 <= 0.0) & (uint)(in_XMM0_Db + 0.0)) - 0.0;
  auVar9._12_4_ = (float)(~-(uint)(in_XMM1_Db + 0.0 <= 0.0) & (uint)(in_XMM1_Db + 0.0)) - 0.0;
  auVar9 = minps(auVar8,auVar9);
  window->Pos = auVar9._0_8_;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& rect, const ImVec2& padding)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar)) ? ImVec2(window->Size.x, window->TitleBarHeight()) : window->Size;
    window->Pos = ImMin(rect.Max - padding, ImMax(window->Pos + size_for_clamping, rect.Min + padding) - size_for_clamping);
}